

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O3

void __thiscall Clasp::Cli::JsonOutput::printSummary(JsonOutput *this,Summary *run,bool final)

{
  uint uVar1;
  FacadePtr pCVar2;
  byte bVar3;
  bool bVar4;
  Model *m;
  uint64 uVar5;
  SumVec *pSVar6;
  pointer plVar7;
  ulong uVar8;
  char *pcVar9;
  char *v;
  UPair UVar10;
  Summary *this_00;
  Span<long> sum;
  Span<long> sum_00;
  Span<long> sum_01;
  undefined1 local_48 [8];
  double dStack_40;
  
  uVar1 = (uint)(this->objStack_)._M_string_length;
  while ((uint)!final * 2 + 1 < uVar1) {
    popObject(this);
    uVar1 = (uint)(this->objStack_)._M_string_length;
  }
  bVar3 = (run->result).flags & 3;
  if (bVar3 == 2) {
    pcVar9 = "UNSATISFIABLE";
  }
  else if (bVar3 == 1) {
    bVar4 = ClaspFacade::Summary::optimum(run);
    pcVar9 = "SATISFIABLE";
    if (bVar4) {
      pcVar9 = "OPTIMUM FOUND";
    }
  }
  else {
    pcVar9 = "UNKNOWN";
  }
  printKeyValue(this,"Result",pcVar9);
  if ((this->super_Output).verbose_ == 0) {
    return;
  }
  if (((run->result).flags & 8) != 0) {
    pcVar9 = "INTERRUPTED";
    if ((run->result).signal == '\x0e') {
      pcVar9 = "TIME LIMIT";
    }
    printf("%s%-*s\"%s\": %lu",this->open_,
           (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",pcVar9,1);
    this->open_ = ",\n";
  }
  pushObject(this,"Models",type_object,false);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Number",run->numEnum);
  this->open_ = ",\n";
  pcVar9 = "no";
  if (((run->result).flags & 4) == 0) {
    pcVar9 = "yes";
  }
  printKeyValue(this,"More",pcVar9);
  if (((run->result).flags & 3) == 1) {
    pcVar9 = ClaspFacade::Summary::consequences(run);
    if (pcVar9 != (char *)0x0) {
      pcVar9 = ClaspFacade::Summary::consequences(run);
      v = "unknown";
      if (((run->result).flags & 4) != 0) {
        v = "yes";
      }
      printKeyValue(this,pcVar9,v);
      pCVar2 = run->facade;
      this_00 = run;
      m = ClaspFacade::Summary::model(run);
      local_48 = (undefined1  [8])Output::numCons((Output *)this_00,&(pCVar2->ctx).output,m);
      printCons(this,(UPair *)local_48);
    }
    bVar4 = ClaspFacade::Summary::optimize(run);
    if (bVar4) {
      bVar4 = ClaspFacade::Summary::optimum(run);
      pcVar9 = "unknown";
      if (bVar4) {
        pcVar9 = "yes";
      }
      printKeyValue(this,"Optimum",pcVar9);
      uVar5 = ClaspFacade::Summary::optimal(run);
      printf("%s%-*s\"%s\": %lu",this->open_,
             (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Optimal",uVar5);
      this->open_ = ",\n";
      pSVar6 = ClaspFacade::Summary::costs(run);
      uVar1 = (pSVar6->ebo_).size;
      plVar7 = (pointer)(ulong)uVar1;
      if (plVar7 != (pointer)0x0) {
        plVar7 = (pSVar6->ebo_).buf;
      }
      sum.size._0_4_ = uVar1;
      sum.first = plVar7;
      sum.size._4_4_ = 0;
      printSum(this,"Costs",sum,(wsum_t *)0x0);
    }
  }
  popObject(this);
  bVar4 = ClaspFacade::Summary::hasLower(run);
  if ((!bVar4) || (bVar4 = ClaspFacade::Summary::optimum(run), bVar4)) goto LAB_0012e90f;
  pushObject(this,"Bounds",type_object,false);
  ClaspFacade::Summary::lower((Summary *)local_48);
  UVar10 = (UPair)((ulong)dStack_40 & 0xffffffff);
  if ((UPair)((ulong)dStack_40 & 0xffffffff) != (UPair)0x0) {
    UVar10 = (UPair)local_48;
  }
  sum_00.size._0_4_ = dStack_40._0_4_;
  sum_00.first = (long *)UVar10;
  sum_00.size._4_4_ = 0;
  printSum(this,"Lower",sum_00,(wsum_t *)0x0);
  if ((UPair)local_48 != (UPair)0x0) {
    operator_delete((void *)local_48);
  }
  pSVar6 = ClaspFacade::Summary::costs(run);
  if (pSVar6 == (SumVec *)0x0) {
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    dStack_40 = 0.0;
    uVar8 = 0;
LAB_0012e8e5:
    UVar10.first = 0;
    UVar10.second = 0;
  }
  else {
    pSVar6 = ClaspFacade::Summary::costs(run);
    bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
              ((pod_vector<long,_std::allocator<long>_> *)local_48,pSVar6);
    uVar8 = (ulong)dStack_40 & 0xffffffff;
    UVar10 = (UPair)local_48;
    if (dStack_40._0_4_ == 0) goto LAB_0012e8e5;
  }
  sum_01.size = uVar8;
  sum_01.first = (long *)UVar10;
  printSum(this,"Upper",sum_01,(wsum_t *)0x0);
  if ((UPair)local_48 != (UPair)0x0) {
    operator_delete((void *)local_48);
  }
  popObject(this);
LAB_0012e90f:
  if (final) {
    printf("%s%-*s\"%s\": %lu",this->open_,
           (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Calls",
           (ulong)(run->step + 1));
    this->open_ = ",\n";
  }
  pushObject(this,"Time",type_object,false);
  printKeyValue(this,"Total",run->totalTime);
  printKeyValue(this,"Solve",run->solveTime);
  printKeyValue(this,"Model",run->satTime);
  printKeyValue(this,"Unsat",run->unsatTime);
  printKeyValue(this,"CPU",run->cpuTime);
  popObject(this);
  if (1 < ((uint)(run->facade->ctx).share_ & 0x3ff)) {
    printf("%s%-*s\"%s\": %lu",this->open_,
           (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Threads");
    this->open_ = ",\n";
    printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
           "Winner",(ulong)((uint)(run->facade->ctx).share_ >> 10 & 0x3ff));
    this->open_ = ",\n";
  }
  return;
}

Assistant:

void JsonOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	popUntil(final ? 1u : 3u);
	const char* res = "UNKNOWN";
	if      (run.unsat()) { res = "UNSATISFIABLE"; }
	else if (run.sat())   { res = !run.optimum() ? "SATISFIABLE" : "OPTIMUM FOUND"; }
	printKeyValue("Result", res);
	if (verbosity()) {
		if (run.result.interrupted()){ printKeyValue(run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT", uint32(1));  }
		pushObject("Models");
		printKeyValue("Number", run.numEnum);
		printKeyValue("More"  , run.complete() ? "no" : "yes");
		if (run.sat()) {
			if (run.consequences()){
				printKeyValue(run.consequences(), run.complete() ? "yes":"unknown");
				printCons(numCons(run.ctx().output, *run.model()));
			}
			if (run.optimize())    {
				printKeyValue("Optimum", run.optimum()?"yes":"unknown");
				printKeyValue("Optimal", run.optimal());
				printCosts(*run.costs());
			}
		}
		popObject();
		if (run.hasLower() && !run.optimum()) {
			pushObject("Bounds");
			printCosts(run.lower(), "Lower");
			printCosts(run.costs() ? *run.costs() : SumVec(), "Upper");
			popObject();
		}
		if (final) { printKeyValue("Calls", run.step + 1); }
		pushObject("Time");
		printKeyValue("Total", run.totalTime);
		printKeyValue("Solve", run.solveTime);
		printKeyValue("Model", run.satTime);
		printKeyValue("Unsat", run.unsatTime);
		printKeyValue("CPU"  , run.cpuTime);
		popObject(); // Time
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", run.ctx().concurrency());
			printKeyValue("Winner",  run.ctx().winner());
		}
	}
}